

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOListener.cpp
# Opt level: O0

void __thiscall mognetwork::TcpASIOListener::run(TcpASIOListener *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  ITcpASIOListenerHandler *pIVar3;
  bool bVar4;
  State SVar5;
  SocketFD SVar6;
  ostream *poVar7;
  reference piVar8;
  iterator this_00;
  long in_RDI;
  iterator it2_1;
  iterator it2;
  Status status;
  TcpSocket *socket;
  iterator it;
  list<int,_std::allocator<int>_> triggeredList;
  undefined4 in_stack_fffffffffffffec8;
  SocketFD in_stack_fffffffffffffecc;
  Selector *in_stack_fffffffffffffed0;
  Mutex *in_stack_fffffffffffffee0;
  TcpASIOServer *in_stack_fffffffffffffee8;
  TcpASIOListener *in_stack_fffffffffffffef0;
  SocketFD in_stack_fffffffffffffefc;
  iterator in_stack_ffffffffffffff08;
  list<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  _Self local_70;
  _Self local_68;
  _Self local_60;
  _Self local_58;
  Status local_4c;
  TcpSocket *local_48;
  _Self local_40 [3];
  _Self local_28 [5];
  
  while( true ) {
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Listener Thread stopped.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      return;
    }
    Selector::waitForTrigger(in_stack_fffffffffffffed0);
    SVar5 = Selector::getState((Selector *)(in_RDI + 0x28));
    if (SVar5 == Error) break;
    Selector::getReadingTriggeredSockets_abi_cxx11_((Selector *)(in_RDI + 0x28));
    std::__cxx11::list<int,_std::allocator<int>_>::list
              (in_stack_ffffffffffffff10,
               (list<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08._M_node);
    local_28[0]._M_node =
         (_List_node_base *)
         std::__cxx11::list<int,_std::allocator<int>_>::begin
                   ((list<int,_std::allocator<int>_> *)
                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    while( true ) {
      local_40[0]._M_node =
           (_List_node_base *)
           std::__cxx11::list<int,_std::allocator<int>_>::end
                     ((list<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar4 = std::operator!=(local_28,local_40);
      if (!bVar4) break;
      piVar8 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x11b741);
      iVar1 = *piVar8;
      SVar6 = Socket::getSocketFD(*(Socket **)(in_RDI + 0x1c8));
      if (iVar1 == SVar6) {
        Mutex::lock(in_stack_fffffffffffffee0);
        acceptClient(in_stack_fffffffffffffef0);
        Mutex::unlock(in_stack_fffffffffffffee0);
      }
      else {
        piVar8 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x11b7fe);
        if (*piVar8 != *(int *)(in_RDI + 0x1c0)) {
          Mutex::lock(in_stack_fffffffffffffee0);
          std::_List_iterator<int>::operator*((_List_iterator<int> *)0x11b85d);
          local_48 = TcpASIOServer::getSocketByFd
                               (in_stack_fffffffffffffee8,
                                (SocketFD)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          TcpSocket::setServer
                    ((TcpSocket *)in_stack_fffffffffffffed0,
                     (TcpASIOServer *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
          ;
          local_4c = TcpSocket::readPendingDatas((TcpSocket *)in_stack_fffffffffffffee8);
          if (local_4c == Ok) {
            local_58._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                 ::begin((list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            while( true ) {
              local_60._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                   ::end((list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
              bVar4 = std::operator!=(&local_58,&local_60);
              if (!bVar4) break;
              in_stack_ffffffffffffff10 =
                   (list<int,_std::allocator<int>_> *)
                   std::_List_iterator<mognetwork::ITcpASIOListenerHandler_*>::operator*
                             ((_List_iterator<mognetwork::ITcpASIOListenerHandler_*> *)0x11b955);
              p_Var2 = (in_stack_ffffffffffffff10->super__List_base<int,_std::allocator<int>_>).
                       _M_impl._M_node.super__List_node_base._M_next;
              (*(code *)*(_List_node_base **)((long)(p_Var2->_M_next + 1) + 8))(p_Var2,local_48);
              std::_List_iterator<mognetwork::ITcpASIOListenerHandler_*>::operator++(&local_58);
            }
          }
          else if (local_4c != Waiting) {
            in_stack_ffffffffffffff08 =
                 std::__cxx11::
                 list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                 ::begin((list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            local_68._M_node = in_stack_ffffffffffffff08._M_node;
            while( true ) {
              this_00 = std::__cxx11::
                        list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                        ::end((list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                               *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
              local_70._M_node = this_00._M_node;
              bVar4 = std::operator!=(&local_68,&local_70);
              in_stack_fffffffffffffefc = CONCAT13(bVar4,(int3)in_stack_fffffffffffffefc);
              if (!bVar4) break;
              in_stack_fffffffffffffef0 =
                   (TcpASIOListener *)
                   std::_List_iterator<mognetwork::ITcpASIOListenerHandler_*>::operator*
                             ((_List_iterator<mognetwork::ITcpASIOListenerHandler_*> *)0x11ba1c);
              pIVar3 = (ITcpASIOListenerHandler *)
                       (in_stack_fffffffffffffef0->super_IRunnable)._vptr_IRunnable;
              (**(code **)(*(long *)pIVar3 + 0x20))(pIVar3,local_48);
              std::_List_iterator<mognetwork::ITcpASIOListenerHandler_*>::operator++(&local_68);
            }
            in_stack_fffffffffffffee0 = (Mutex *)(in_RDI + 0x28);
            in_stack_fffffffffffffee8 =
                 (TcpASIOServer *)
                 std::_List_iterator<int>::operator*((_List_iterator<int> *)0x11ba72);
            Selector::remFdToRead(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            in_stack_fffffffffffffed0 = *(Selector **)(in_RDI + 0x1e0);
            std::_List_iterator<int>::operator*((_List_iterator<int> *)0x11baad);
            TcpASIOServer::remSocket((TcpASIOServer *)this_00._M_node,in_stack_fffffffffffffefc);
          }
          Mutex::unlock(in_stack_fffffffffffffee0);
        }
      }
      std::_List_iterator<int>::operator++(local_28);
    }
    std::__cxx11::list<int,_std::allocator<int>_>::~list
              ((list<int,_std::allocator<int>_> *)0x11bb08);
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,"Select error on listening thread.");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TcpASIOListener::run()
  {
    while (m_running)
      {
	m_selector.waitForTrigger();
	if (m_selector.getState() == Selector::Error)
	  {
	    std::cerr << "Select error on listening thread." << std::endl;
	    return ;
	}
	std::list<SocketFD> triggeredList = m_selector.getReadingTriggeredSockets();
	for (std::list<SocketFD>::iterator it = triggeredList.begin(); it != triggeredList.end(); ++it)
	  {
	    if (*it == m_serverSocket.getSocketFD())
	      {
		m_mutex->lock();
		// NEW CLIENT TO ACCEPT
		acceptClient();
		m_mutex->unlock();
	      }
	    else if (*it != m_pipefd[0])
	      {
		m_mutex->lock();
		TcpSocket* socket = m_server->getSocketByFd(*it);
		socket->setServer(m_server);
		Socket::Status status = socket->readPendingDatas();
		if (status == Socket::Ok)
		  {
		    // DATAS FULLY RECEIVED.
		    for (std::list<ITcpASIOListenerHandler*>::iterator it2 = m_listeners.begin();
			 it2 != m_listeners.end(); ++it2)
		      (*it2)->onReceivedData(*socket);
		  }
		else if (status != Socket::Waiting)
		  {
		    // DISCONNECTED
		    for (std::list<ITcpASIOListenerHandler*>::iterator it2 = m_listeners.begin();
			 it2 != m_listeners.end(); ++it2)
		      (*it2)->onDisconnect(*socket);
		    m_selector.remFdToRead(*it);
		    m_server->remSocket(*it);
		  }
		m_mutex->unlock();
	      }
	  }
      }
    std::cout << "Listener Thread stopped." << std::endl;
  }